

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_GetFontVMetrics(stbtt_fontinfo *info,int *ascent,int *descent,int *lineGap)

{
  stbtt_int16 sVar1;
  int *lineGap_local;
  int *descent_local;
  int *ascent_local;
  stbtt_fontinfo *info_local;
  
  if (ascent != (int *)0x0) {
    sVar1 = ttSHORT(info->data + (long)info->hhea + 4);
    *ascent = (int)sVar1;
  }
  if (descent != (int *)0x0) {
    sVar1 = ttSHORT(info->data + (long)info->hhea + 6);
    *descent = (int)sVar1;
  }
  if (lineGap != (int *)0x0) {
    sVar1 = ttSHORT(info->data + (long)info->hhea + 8);
    *lineGap = (int)sVar1;
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_GetFontVMetrics(const stbtt_fontinfo *info, int *ascent, int *descent, int *lineGap)
{
   if (ascent ) *ascent  = ttSHORT(info->data+info->hhea + 4);
   if (descent) *descent = ttSHORT(info->data+info->hhea + 6);
   if (lineGap) *lineGap = ttSHORT(info->data+info->hhea + 8);
}